

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O2

void test_convert<int,double>(uint length,int value)

{
  _func_int ***ppp_Var1;
  int *piVar2;
  double *__p;
  long lVar3;
  undefined8 *puVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  int *local_40;
  shared_ptr<int> pt;
  shared_ptr<double> pu;
  
  piVar2 = nosimd::common::malloc<int>(length);
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void(*)(int*),void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&local_40,piVar2,
             nosimd::common::free<int>);
  __p = nosimd::common::malloc<double>(length);
  std::__shared_ptr<double,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<double,void(*)(double*),void>
            ((__shared_ptr<double,(__gnu_cxx::_Lock_policy)2> *)
             &pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p,
             nosimd::common::free<double>);
  piVar2 = local_40;
  for (iVar5 = (int)length >> 2; 3 < iVar5; iVar5 = iVar5 + -4) {
    *piVar2 = value;
    piVar2[1] = value;
    piVar2[2] = value;
    piVar2[3] = value;
    piVar2[4] = value;
    piVar2[5] = value;
    piVar2[6] = value;
    piVar2[7] = value;
    piVar2[8] = value;
    piVar2[9] = value;
    piVar2[10] = value;
    piVar2[0xb] = value;
    piVar2[0xc] = value;
    piVar2[0xd] = value;
    piVar2[0xe] = value;
    piVar2[0xf] = value;
    piVar2 = piVar2 + 0x10;
  }
  if (1 < iVar5) {
    *piVar2 = value;
    piVar2[1] = value;
    piVar2[2] = value;
    piVar2[3] = value;
    piVar2[4] = value;
    piVar2[5] = value;
    piVar2[6] = value;
    piVar2[7] = value;
    iVar5 = iVar5 + -2;
    piVar2 = piVar2 + 8;
  }
  if (iVar5 != 0) {
    *piVar2 = value;
    piVar2[1] = value;
    piVar2[2] = value;
    piVar2[3] = value;
  }
  for (lVar3 = (long)(int)(length & 0xfffffffc); lVar3 < (int)length; lVar3 = lVar3 + 1) {
    local_40[lVar3] = value;
  }
  nosimd::common::convert<int,double>
            (local_40,(double *)
                      pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar6 = 0;
  do {
    if (length == uVar6) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt);
      return;
    }
    ppp_Var1 = &(pt.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar6;
    dVar8 = (double)*ppp_Var1 - (double)value;
    uVar7 = -(ulong)(dVar8 < 0.0);
    uVar6 = uVar6 + 1;
  } while ((double)(~uVar7 & (ulong)dVar8 | (ulong)((double)value - (double)*ppp_Var1) & uVar7) <
           2.220446049250313e-16);
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = "void test_convert(unsigned int, _T) [_T = int, _U = double]";
  *(undefined4 *)(puVar4 + 1) = 0x17;
  *(uint *)((long)puVar4 + 0xc) = length;
  __cxa_throw(puVar4,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}